

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFx.c
# Opt level: O1

Vec_Int_t *
Gia_ManFxTopoOrder(Vec_Wec_t *vCubes,int nInputs,int nStart,Vec_Int_t **pvFirst,Vec_Int_t **pvCount)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  bool bVar4;
  Vec_Int_t *vFirst;
  int *piVar5;
  Vec_Int_t *vCount;
  int *piVar6;
  Vec_Int_t *vOrder;
  Vec_Int_t *vVisit;
  uint uVar7;
  int iVar8;
  int **ppiVar9;
  size_t __n;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  
  if ((long)vCubes->nSize < 1) {
    uVar11 = 0xffffffff;
  }
  else {
    uVar11 = 0xffffffff;
    lVar12 = 0;
    do {
      if (*(int *)((long)&vCubes->pArray->nSize + lVar12) < 1) goto LAB_006adb80;
      uVar1 = **(uint **)((long)&vCubes->pArray->pArray + lVar12);
      if ((int)uVar11 <= (int)uVar1) {
        uVar11 = uVar1;
      }
      lVar12 = lVar12 + 0x10;
    } while ((long)vCubes->nSize * 0x10 != lVar12);
  }
  uVar1 = uVar11 + 1;
  if (uVar1 == nStart) {
    vOrder = (Vec_Int_t *)0x0;
  }
  else {
    vFirst = (Vec_Int_t *)malloc(0x10);
    uVar7 = 0x10;
    if (0xe < uVar11) {
      uVar7 = uVar1;
    }
    vFirst->nSize = 0;
    vFirst->nCap = uVar7;
    uVar10 = (ulong)uVar7;
    if (uVar7 == 0) {
      piVar5 = (int *)0x0;
    }
    else {
      piVar5 = (int *)malloc(uVar10 * 4);
    }
    vFirst->pArray = piVar5;
    vFirst->nSize = uVar1;
    __n = (ulong)uVar1 << 2;
    piVar6 = (int *)0x0;
    memset(piVar5,0,__n);
    vCount = (Vec_Int_t *)malloc(0x10);
    vCount->nSize = 0;
    vCount->nCap = uVar7;
    if (uVar7 != 0) {
      piVar6 = (int *)malloc(uVar10 * 4);
    }
    vCount->pArray = piVar6;
    vCount->nSize = uVar1;
    memset(piVar6,0,__n);
    iVar8 = vCubes->nSize;
    if (0 < (long)iVar8) {
      ppiVar9 = &vCubes->pArray->pArray;
      lVar12 = 0;
      do {
        if (*(int *)((long)ppiVar9 + -4) < 1) goto LAB_006adb80;
        uVar2 = **ppiVar9;
        if ((int)uVar2 < nInputs) {
          __assert_fail("iFanin >= nInputs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaFx.c"
                        ,0x126,
                        "Vec_Int_t *Gia_ManFxTopoOrder(Vec_Wec_t *, int, int, Vec_Int_t **, Vec_Int_t **)"
                       );
        }
        if (((int)uVar2 < 0) || (vCount->nSize <= (int)uVar2)) goto LAB_006adb80;
        iVar3 = piVar6[uVar2];
        if (iVar3 == 0) {
          if (vFirst->nSize <= (int)uVar2) goto LAB_006adb9f;
          piVar5[uVar2] = (int)lVar12;
        }
        piVar6[uVar2] = iVar3 + 1;
        lVar12 = lVar12 + 1;
        ppiVar9 = ppiVar9 + 2;
      } while (iVar8 != lVar12);
    }
    vOrder = (Vec_Int_t *)malloc(0x10);
    iVar8 = 0x10;
    if (0xe < nInputs - 1U) {
      iVar8 = nInputs;
    }
    vOrder->nSize = 0;
    vOrder->nCap = iVar8;
    if (iVar8 == 0) {
      piVar5 = (int *)0x0;
    }
    else {
      piVar5 = (int *)malloc((long)iVar8 << 2);
    }
    vOrder->pArray = piVar5;
    vOrder->nSize = nInputs;
    piVar6 = (int *)0x0;
    memset(piVar5,0,(long)nInputs << 2);
    vVisit = (Vec_Int_t *)malloc(0x10);
    vVisit->nSize = 0;
    vVisit->nCap = uVar7;
    if (uVar7 != 0) {
      piVar6 = (int *)malloc(uVar10 << 2);
    }
    vVisit->pArray = piVar6;
    vVisit->nSize = uVar1;
    memset(piVar6,0,__n);
    if (0 < nInputs) {
      uVar7 = 0xffffffff;
      if (-1 < (int)uVar11) {
        uVar7 = uVar11;
      }
      uVar10 = 0;
      do {
        if (uVar7 + 1 == uVar10) {
LAB_006adb9f:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        piVar6[uVar10] = 1;
        uVar10 = uVar10 + 1;
      } while ((uint)nInputs != uVar10);
    }
    if (nInputs <= (int)uVar11) {
      piVar5 = piVar6 + (uint)nInputs;
      iVar8 = nInputs;
      do {
        if (nInputs < 0) {
LAB_006adb80:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if (*piVar5 == 0) {
          Gia_ManFxTopoOrder_rec(vCubes,vFirst,vCount,vVisit,vOrder,iVar8);
        }
        piVar5 = piVar5 + 1;
        bVar4 = iVar8 < (int)uVar11;
        iVar8 = iVar8 + 1;
      } while (bVar4);
    }
    if (vOrder->nSize != uVar1) {
      __assert_fail("Vec_IntSize(vOrder) == nNodeMax",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaFx.c"
                    ,0x133,
                    "Vec_Int_t *Gia_ManFxTopoOrder(Vec_Wec_t *, int, int, Vec_Int_t **, Vec_Int_t **)"
                   );
    }
    if (piVar6 != (int *)0x0) {
      free(piVar6);
      vVisit->pArray = (int *)0x0;
    }
    free(vVisit);
    *pvFirst = vFirst;
    *pvCount = vCount;
  }
  return vOrder;
}

Assistant:

Vec_Int_t * Gia_ManFxTopoOrder( Vec_Wec_t * vCubes, int nInputs, int nStart, Vec_Int_t ** pvFirst, Vec_Int_t ** pvCount )
{
    Vec_Int_t * vOrder, * vFirst, * vCount, * vVisit, * vCube;
    int i, iFanin, nNodeMax = -1;
    // find the largest index
    Vec_WecForEachLevel( vCubes, vCube, i )
        nNodeMax = Abc_MaxInt( nNodeMax, Vec_IntEntry(vCube, 0) );
    nNodeMax++;
    // quit if there is no new nodes
    if ( nNodeMax == nStart )
    {
        //printf( "The network is unchanged by fast extract.\n" );
        return NULL;
    }
    // find first cube and how many cubes
    vFirst = Vec_IntStart( nNodeMax );
    vCount = Vec_IntStart( nNodeMax );
    Vec_WecForEachLevel( vCubes, vCube, i )
    {
        iFanin = Vec_IntEntry( vCube, 0 );
        assert( iFanin >= nInputs );
        if ( Vec_IntEntry(vCount, iFanin) == 0 )
            Vec_IntWriteEntry( vFirst, iFanin, i );
        Vec_IntAddToEntry( vCount, iFanin, 1 );
    }
    // put all of them in a topo order
    vOrder = Vec_IntStart( nInputs );
    vVisit = Vec_IntStart( nNodeMax );
    for ( i = 0; i < nInputs; i++ )
        Vec_IntWriteEntry( vVisit, i, 1 );
    for ( i = nInputs; i < nNodeMax; i++ )
        if ( !Vec_IntEntry( vVisit, i ) )
            Gia_ManFxTopoOrder_rec( vCubes, vFirst, vCount, vVisit, vOrder, i );
    assert( Vec_IntSize(vOrder) == nNodeMax );
    Vec_IntFree( vVisit );
    // return topological order of new nodes
    *pvFirst = vFirst;
    *pvCount = vCount;
    return vOrder;
}